

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pvip_node.c
# Opt level: O2

PVIPNode * PVIP_node_append_string_node(PVIPParserContext *parser,PVIPNode *node,PVIPNode *stuff)

{
  PVIPNode *pPVar1;
  
  if ((node->type != PVIP_NODE_STRING) && (node->type != PVIP_NODE_STRING_CONCAT)) {
    abort();
  }
  pPVar1 = PVIP_node_new_children2(parser,PVIP_NODE_STRING_CONCAT,node,stuff);
  return pPVar1;
}

Assistant:

PVIPNode* PVIP_node_append_string_node(PVIPParserContext *parser, PVIPNode*node, PVIPNode*stuff) {
    if (node->type == PVIP_NODE_STRING) {
        return PVIP_node_new_children2(parser, PVIP_NODE_STRING_CONCAT, node, stuff);
    } else if (node->type == PVIP_NODE_STRING_CONCAT) {
        return PVIP_node_new_children2(parser, PVIP_NODE_STRING_CONCAT, node, stuff);
    } else {
        abort();
    }
}